

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O3

void __thiscall
helics::EndpointInfo::disconnectFederate(EndpointInfo *this,GlobalFederateId fedToDisconnect)

{
  pointer ppVar1;
  pointer pEVar2;
  pointer pEVar3;
  long lVar4;
  pointer pEVar5;
  long lVar6;
  long lVar7;
  iterator iVar8;
  EndpointInformation *targetInfo;
  iterator __first;
  
  pEVar3 = (this->targetInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar8._M_current =
       (this->targetInformation).
       super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar3 != iVar8._M_current) {
    lVar6 = (long)iVar8._M_current - (long)pEVar3;
    lVar4 = (lVar6 >> 3) * -0x71c71c71c71c71c7 >> 2;
    if (0 < lVar4) {
      lVar6 = lVar4 + 1;
      __first._M_current = pEVar3 + 2;
      do {
        if (__first._M_current[-2].id.fed_id.gid == fedToDisconnect.gid) {
          __first._M_current = __first._M_current + -2;
          goto LAB_0032930b;
        }
        if (__first._M_current[-1].id.fed_id.gid == fedToDisconnect.gid) {
          __first._M_current = __first._M_current + -1;
          goto LAB_0032930b;
        }
        if (((__first._M_current)->id).fed_id.gid == fedToDisconnect.gid) goto LAB_0032930b;
        if (__first._M_current[1].id.fed_id.gid == fedToDisconnect.gid) {
          __first._M_current = __first._M_current + 1;
          goto LAB_0032930b;
        }
        lVar6 = lVar6 + -1;
        __first._M_current = __first._M_current + 4;
      } while (1 < lVar6);
      lVar6 = (long)iVar8._M_current - (long)(pEVar3 + lVar4 * 4);
      pEVar3 = pEVar3 + lVar4 * 4;
    }
    lVar4 = (lVar6 >> 3) * -0x71c71c71c71c71c7;
    if (lVar4 == 1) {
LAB_003292ed:
      __first._M_current = pEVar3;
      if ((pEVar3->id).fed_id.gid != fedToDisconnect.gid) {
        __first._M_current = iVar8._M_current;
      }
    }
    else if (lVar4 == 2) {
LAB_003292e5:
      __first._M_current = pEVar3;
      if ((pEVar3->id).fed_id.gid != fedToDisconnect.gid) {
        pEVar3 = pEVar3 + 1;
        goto LAB_003292ed;
      }
    }
    else {
      if (lVar4 != 3) goto LAB_003293be;
      __first._M_current = pEVar3;
      if ((pEVar3->id).fed_id.gid != fedToDisconnect.gid) {
        pEVar3 = pEVar3 + 1;
        goto LAB_003292e5;
      }
    }
LAB_0032930b:
    pEVar3 = __first._M_current + 1;
    if (pEVar3 != iVar8._M_current && __first._M_current != iVar8._M_current) {
      do {
        if ((pEVar3->id).fed_id.gid != fedToDisconnect.gid) {
          (__first._M_current)->id = pEVar3->id;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(__first._M_current)->key,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pEVar3->key);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &(__first._M_current)->type,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pEVar3->type);
          __first._M_current = __first._M_current + 1;
        }
        pEVar3 = pEVar3 + 1;
      } while (pEVar3 != iVar8._M_current);
      iVar8._M_current =
           (this->targetInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (__first._M_current != iVar8._M_current) {
      std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
      _M_erase(&this->targetInformation,__first,iVar8);
      ppVar1 = (this->targets).
               super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->targets).
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
        (this->targets).
        super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
      }
      pEVar3 = (this->targetInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar2 = (this->targetInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pEVar3 != pEVar2) {
        do {
          std::
          vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
          ::emplace_back<helics::GlobalHandle_const&,std::__cxx11::string_const&>
                    ((vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
                      *)&this->targets,&pEVar3->id,&pEVar3->key);
          pEVar3 = pEVar3 + 1;
        } while (pEVar3 != pEVar2);
      }
    }
  }
LAB_003293be:
  pEVar3 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->sourceInformation).
           super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar3 == pEVar2) {
    return;
  }
  lVar6 = (long)pEVar2 - (long)pEVar3;
  lVar7 = (lVar6 >> 3) * -0x71c71c71c71c71c7 >> 2;
  pEVar5 = pEVar3;
  lVar4 = lVar6;
  if (0 < lVar7) {
    pEVar5 = pEVar3 + lVar7 * 4;
    lVar7 = lVar7 + 1;
    iVar8._M_current = pEVar3 + 2;
    do {
      if (iVar8._M_current[-2].id.fed_id.gid == fedToDisconnect.gid) {
        iVar8._M_current = iVar8._M_current + -2;
        goto LAB_0032949d;
      }
      if (iVar8._M_current[-1].id.fed_id.gid == fedToDisconnect.gid) {
        iVar8._M_current = iVar8._M_current + -1;
        goto LAB_0032949d;
      }
      if (((iVar8._M_current)->id).fed_id.gid == fedToDisconnect.gid) goto LAB_0032949d;
      if (iVar8._M_current[1].id.fed_id.gid == fedToDisconnect.gid) {
        iVar8._M_current = iVar8._M_current + 1;
        goto LAB_0032949d;
      }
      lVar7 = lVar7 + -1;
      iVar8._M_current = iVar8._M_current + 4;
    } while (1 < lVar7);
    lVar4 = (long)pEVar2 - (long)pEVar5;
  }
  lVar4 = (lVar4 >> 3) * -0x71c71c71c71c71c7;
  if (lVar4 == 1) {
LAB_00329470:
    iVar8._M_current = pEVar5;
    if ((pEVar5->id).fed_id.gid != fedToDisconnect.gid) {
      iVar8._M_current = pEVar2;
    }
  }
  else if (lVar4 == 2) {
LAB_00329468:
    iVar8._M_current = pEVar5;
    if ((pEVar5->id).fed_id.gid != fedToDisconnect.gid) {
      pEVar5 = pEVar5 + 1;
      goto LAB_00329470;
    }
  }
  else {
    iVar8._M_current = pEVar2;
    if (lVar4 != 3) goto LAB_00329502;
    iVar8._M_current = pEVar5;
    if ((pEVar5->id).fed_id.gid != fedToDisconnect.gid) {
      pEVar5 = pEVar5 + 1;
      goto LAB_00329468;
    }
  }
LAB_0032949d:
  pEVar5 = iVar8._M_current + 1;
  if (pEVar5 != pEVar2 && iVar8._M_current != pEVar2) {
    do {
      if ((pEVar5->id).fed_id.gid != fedToDisconnect.gid) {
        (iVar8._M_current)->id = pEVar5->id;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(iVar8._M_current)->key,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar5->key)
        ;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(iVar8._M_current)->type,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar5->type
                 );
        iVar8._M_current = iVar8._M_current + 1;
      }
      pEVar5 = pEVar5 + 1;
    } while (pEVar5 != pEVar2);
    pEVar3 = (this->sourceInformation).
             super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(this->sourceInformation).
                  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3;
  }
LAB_00329502:
  std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::_M_erase
            (&this->sourceInformation,iVar8,
             (EndpointInformation *)((long)&(pEVar3->id).fed_id.gid + lVar6));
  return;
}

Assistant:

void EndpointInfo::disconnectFederate(GlobalFederateId fedToDisconnect)
{
    if (!targetInformation.empty()) {
        auto removeIterator = std::remove_if(targetInformation.begin(),
                                             targetInformation.end(),
                                             [fedToDisconnect](const auto& targetInfo) {
                                                 return targetInfo.id.fed_id == fedToDisconnect;
                                             });
        if (removeIterator != targetInformation.end()) {
            targetInformation.erase(removeIterator, targetInformation.end());
            targets.clear();
            for (const auto& targetInfo : targetInformation) {
                targets.emplace_back(targetInfo.id, targetInfo.key);
            }
        }
    }
    if (!sourceInformation.empty()) {
        auto removeIterator = std::remove_if(sourceInformation.begin(),
                                             sourceInformation.end(),
                                             [fedToDisconnect](const auto& sinfo) {
                                                 return sinfo.id.fed_id == fedToDisconnect;
                                             });
        sourceInformation.erase(removeIterator, sourceInformation.end());
    }
}